

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DDALine.h
# Opt level: O0

void __thiscall
TRM::dda2_line_interpolator::dda2_line_interpolator
          (dda2_line_interpolator *this,int y1,int y2,int count)

{
  int local_2c;
  int count_local;
  int y2_local;
  int y1_local;
  dda2_line_interpolator *this_local;
  
  local_2c = count;
  if (count < 1) {
    local_2c = 1;
  }
  this->m_cnt = local_2c;
  this->m_lft = (y2 - y1) / this->m_cnt;
  this->m_rem = (y2 - y1) % this->m_cnt;
  this->m_mod = this->m_rem;
  this->m_y = y1;
  if (this->m_mod < 1) {
    this->m_mod = count + this->m_mod;
    this->m_rem = count + this->m_rem;
    this->m_lft = this->m_lft + -1;
  }
  this->m_mod = this->m_mod - count;
  return;
}

Assistant:

dda2_line_interpolator(int y1, int y2, int count)
      : m_cnt(count <= 0 ? 1 : count),
        m_lft((y2 - y1) / m_cnt),
        m_rem((y2 - y1) % m_cnt),
        m_mod(m_rem),
        m_y(y1) {
    if (m_mod <= 0) {
      m_mod += count;
      m_rem += count;
      m_lft--;
    }
    m_mod -= count;
  }